

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O2

void parse_preproc_ifndef_line(Source_File *src,Translation_Data *translation_data)

{
  token *ptVar1;
  void *pvVar2;
  
  ptVar1 = get_next_token(src,chonky,'\0');
  if ((ptVar1 != (token *)0x0) && (ptVar1->type == KW_ID)) {
    pvVar2 = Map_Check(translation_data->macros,ptVar1->data,ptVar1->data_size);
    free(ptVar1);
    if (pvVar2 == (void *)0x0) {
      preproc_lex_first_part(src,translation_data);
    }
    else {
      ptVar1 = preproc_find_else(src,translation_data,'\x01');
      if (ptVar1 != (token *)0x0) {
        if (ptVar1->type == PKW_ELIF) {
          parse_preproc_if_line(src,translation_data);
        }
        else {
          preproc_find_else(src,translation_data,'\0');
          preproc_lex_first_part(src,translation_data);
        }
      }
      free(ptVar1);
    }
    chase_new_line(src,translation_data);
    return;
  }
  push_lexing_error("expected an id here",src,translation_data);
  chase_new_line(src,translation_data);
  free(ptVar1);
  return;
}

Assistant:

void parse_preproc_ifndef_line(struct Source_File *src,struct Translation_Data *translation_data)
{
	struct token *hold_token;
	hold_token=get_next_token(src,&chonky[0],0);
	if(hold_token==NULL || hold_token->type!=KW_ID)
	{
		push_lexing_error("expected an id here",src,translation_data);
		chase_new_line(src,translation_data);
		free(hold_token);
		return;
	}else
	{
		if(!Map_Check(translation_data->macros,hold_token->data,hold_token->data_size))
		{
			free(hold_token);
			preproc_lex_first_part(src,translation_data);
		}else
		{
			free(hold_token);

			hold_token=preproc_find_else(src,translation_data,1);
			if(hold_token!=NULL && hold_token->type==PKW_ELIF)
			{
				parse_preproc_if_line(src,translation_data);
			}
			else if(hold_token!=NULL)
			{
				preproc_find_else(src,translation_data,0);
				preproc_lex_first_part(src,translation_data);
			}
			free(hold_token);
		}

	}
	chase_new_line(src,translation_data);
}